

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

pthread_key_t testing::internal::ThreadLocal<testing::Sequence_*>::CreateKey(void)

{
  ostream *poVar1;
  int gtest_error;
  pthread_key_t key;
  int in_stack_0000003c;
  char *in_stack_00000040;
  GTestLogSeverity in_stack_0000004c;
  GTestLog *in_stack_00000050;
  GTestLog *this;
  GTestLog local_c;
  int local_8;
  pthread_key_t local_4;
  
  local_8 = pthread_key_create(&local_4,DeleteThreadLocalValue);
  if (local_8 != 0) {
    this = &local_c;
    GTestLog::GTestLog(in_stack_00000050,in_stack_0000004c,in_stack_00000040,in_stack_0000003c);
    poVar1 = GTestLog::GetStream(this);
    poVar1 = std::operator<<(poVar1,"pthread_key_create(&key, &DeleteThreadLocalValue)");
    poVar1 = std::operator<<(poVar1,"failed with error ");
    std::ostream::operator<<(poVar1,local_8);
    GTestLog::~GTestLog(this);
  }
  return local_4;
}

Assistant:

static pthread_key_t CreateKey() {
    pthread_key_t key;
    // When a thread exits, DeleteThreadLocalValue() will be called on
    // the object managed for that thread.
    GTEST_CHECK_POSIX_SUCCESS_(
        pthread_key_create(&key, &DeleteThreadLocalValue));
    return key;
  }